

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  msg_type t_msg;
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  element_type *peVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  int iVar13;
  ptr<peer> p;
  executor exec;
  undefined1 local_d9;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  undefined1 local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Head_base<0UL,_nuraft::raft_server_*,_false> local_98;
  ptr<peer> local_88;
  ptr<peer> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Any_data local_50;
  _Invoker_type local_40;
  
  peVar2 = (err->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (err->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 3 < iVar7)) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar8 = (**(code **)(*(long *)err + 0x10))(err);
    msg_if_given_abi_cxx11_
              ((string *)local_c8,"receive an rpc error response from peer server, %s %d",uVar8,
               (ulong)(peVar2->super_msg_base).type_);
    (*peVar3->_vptr_logger[8])
              (peVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"handle_ext_resp_err",0x5b5,local_c8);
    if (local_c8 != (undefined1  [8])&local_b8) {
      operator_delete((void *)local_c8);
    }
  }
  if ((((peVar2->super_msg_base).type_ == install_snapshot_request) &&
      (peVar4 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar4 != (element_type *)0x0)) &&
     (((peVar4->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->id_ == (peVar2->super_msg_base).dst_)) {
    local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    bVar6 = check_snapshot_timeout(this,&local_78);
    if (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (!bVar6) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 2 < iVar7)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_c8,
                   "sending snapshot to joining server %d failed, retry with temp heartbeat",
                   (ulong)(uint)((((this->srv_to_join_).
                                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_ext_resp_err",0x5bd,local_c8);
        if (local_c8 != (undefined1  [8])&local_b8) {
          operator_delete((void *)local_c8);
        }
      }
      LOCK();
      (this->srv_to_join_snp_retry_required_)._M_base._M_i = true;
      UNLOCK();
      enable_hb_for_peer(this,(this->srv_to_join_).
                              super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  t_msg = (peVar2->super_msg_base).type_;
  if ((leave_cluster_request < t_msg) ||
     ((0x5400U >> (t_msg & (custom_notification_request|append_entries_request)) & 1) == 0))
  goto LAB_0019eb71;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (t_msg == leave_cluster_request) {
    iVar7 = (peVar2->super_msg_base).dst_;
    uVar5 = (this->peers_)._M_h._M_bucket_count;
    uVar9 = (ulong)(long)iVar7 % uVar5;
    p_Var11 = (this->peers_)._M_h._M_buckets[uVar9];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var10 = p_Var11->_M_nxt, p_Var12 = p_Var11, iVar7 != *(int *)&p_Var11->_M_nxt[1]._M_nxt))
    {
      while (p_Var11 = p_Var10, p_Var10 = p_Var11->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var10[1]._M_nxt % uVar5 != uVar9) ||
           (p_Var12 = p_Var11, iVar7 == *(int *)&p_Var10[1]._M_nxt)) goto LAB_0019e8f8;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_0019e8f8:
    if (p_Var12 == (__node_base_ptr)0x0) {
      p_Var10 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var10 = p_Var12->_M_nxt;
    }
    if (p_Var10 != (_Hash_node_base *)0x0) {
      local_d8 = (element_type *)p_Var10[2]._M_nxt;
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 3);
      goto LAB_0019e91a;
    }
  }
  else {
    local_d8 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    __r = &(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
LAB_0019e91a:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_d0,__r);
  }
  if (local_d8 != (element_type *)0x0) {
    iVar7 = (local_d8->current_hb_interval_).super___atomic_base<int>._M_i;
    context::get_params((context *)local_c8);
    iVar1 = *(int *)((long)local_c8 + 8);
    iVar13 = *(int *)((long)local_c8 + 4) - iVar1 / 2;
    if (iVar13 < iVar1) {
      iVar13 = iVar1;
    }
    if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
    }
    if (iVar7 < iVar13) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 4 < iVar7)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_c8,"retry the request");
        (*peVar3->_vptr_logger[8])
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_ext_resp_err",0x5dd,local_c8);
        if (local_c8 != (undefined1  [8])&local_b8) {
          operator_delete((void *)local_c8);
        }
      }
      iVar7 = (local_d8->current_hb_interval_).super___atomic_base<int>._M_i +
              local_d8->rpc_backoff_;
      if (local_d8->max_hb_interval_ <= iVar7) {
        iVar7 = local_d8->max_hb_interval_;
      }
      LOCK();
      (local_d8->current_hb_interval_).super___atomic_base<int>._M_i = iVar7;
      UNLOCK();
      local_c8 = (undefined1  [8])on_retryable_req_err;
      _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_a8 = local_d8;
      local_a0._M_pi = _Stack_d0._M_pi;
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
        }
      }
      local_b8._M_allocated_capacity = (size_type)peVar2;
      local_b8._8_8_ = this_00;
      local_98._M_head_impl = this;
      std::function<void()>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&)>,void>
                ((function<void()> *)local_50._M_pod_data,
                 (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
                  *)local_c8);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::timer_task<void>,std::allocator<nuraft::timer_task<void>>,std::function<void()>&>
                (a_Stack_60,(timer_task<void> **)&local_68,
                 (allocator<nuraft::timer_task<void>_> *)&local_d9,(function<void_()> *)&local_50);
      local_c8 = (undefined1  [8])local_68;
      _Stack_c0._M_pi = a_Stack_60[0]._M_pi;
      schedule_task(this,(ptr<delayed_task> *)local_c8,
                    (local_d8->current_hb_interval_).super___atomic_base<int>._M_i);
      if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
      }
      if (local_40 != (_Invoker_type)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
    else {
      local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
      local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_d0._M_pi;
      if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
        }
      }
      handle_join_leave_rpc_err(this,t_msg,&local_88);
      if (local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
  }
  if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
  }
LAB_0019eb71:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err) {
    ptr<req_msg> req = err.req();
    p_in( "receive an rpc error response from peer server, %s %d",
          err.what(), req->get_type() );

    if ( req->get_type() == msg_type::install_snapshot_request ) {
        if (srv_to_join_ && srv_to_join_->get_id() == req->get_dst()) {
            bool timed_out = check_snapshot_timeout(srv_to_join_);
            if (!timed_out) {
                // Enable temp HB to retry snapshot.
                p_wn("sending snapshot to joining server %d failed, "
                     "retry with temp heartbeat", srv_to_join_->get_id());
                srv_to_join_snp_retry_required_ = true;
                enable_hb_for_peer(*srv_to_join_);
            }
        }
    }

    if ( req->get_type() != msg_type::sync_log_request     &&
         req->get_type() != msg_type::join_cluster_request &&
         req->get_type() != msg_type::leave_cluster_request ) {
        return;
    }

    ptr<peer> p;
    msg_type t_msg = req->get_type();
    int32 peer_id = req->get_dst();
    if (t_msg == msg_type::leave_cluster_request) {
        peer_itor pit = peers_.find(peer_id);
        if (pit != peers_.end()) {
            p = pit->second;
        }
    } else {
        p = srv_to_join_;
    }
    if (!p) return;

    if (p->get_current_hb_interval() >= ctx_->get_params()->max_hb_interval()) {
        handle_join_leave_rpc_err(t_msg, p);

    } else {
        // reuse the heartbeat interval value to indicate
        // when to stop retrying, as rpc backoff is the same.
        p_db("retry the request");
        p->slow_down_hb();
        timer_task<void>::executor exec =
            (timer_task<void>::executor)
            std::bind( &raft_server::on_retryable_req_err, this, p, req );
        ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
        schedule_task(task, p->get_current_hb_interval());
    }
}